

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O3

void QUnicodeTools::Tailored::indicAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  byte bVar1;
  char16_t cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (0 < len) {
    lVar7 = 0;
    do {
      cVar2 = text[from + lVar7];
      uVar9 = (uint)(ushort)cVar2;
      if ((ushort)(cVar2 + L'\xf200') < 0xfb00) {
        lVar11 = 1;
        uVar3 = 1;
        if (uVar9 == 0x25cc) {
LAB_0033def1:
          lVar10 = len - lVar7;
          lVar11 = 1;
          lVar12 = 1;
          if (1 < lVar10) {
            do {
              lVar11 = lVar12;
              uVar6 = (uint)(ushort)text[from + lVar7 + lVar11];
              if ((ushort)(text[from + lVar7 + lVar11] + L'\xf200') < 0xfb00) {
                if (uVar6 != 0x25cc) {
                  uVar8 = ((uVar6 & 0xfffffffe) != 0x200c) + 9;
                  goto LAB_0033df50;
                }
switchD_0033df64_caseD_1:
                if ((uVar3 != 3) ||
                   ((uVar5 = 1, script == Script_Sinhala &&
                    (text[from + lVar7 + lVar11 + -1] != L'\x200d')))) break;
              }
              else {
                uVar8 = (uint)(byte)indicForms[uVar6 - 0x900];
LAB_0033df50:
                uVar5 = uVar8;
                switch(uVar8) {
                case 0:
                case 7:
                case 10:
                  goto switchD_0033df64_caseD_0;
                case 1:
                  goto switchD_0033df64_caseD_1;
                case 2:
                  uVar5 = 2;
                  if (uVar3 != 1) goto switchD_0033df64_caseD_0;
                  break;
                case 3:
                  uVar5 = 3;
                  if (1 < uVar3 - 1) {
                    if (lVar11 == 1 && script == Script_Bengali) {
                      if ((cVar2 != L'অ') && (uVar9 != 0x98f)) {
                        lVar11 = 1;
                        goto switchD_0033df64_caseD_0;
                      }
                    }
                    else {
                      uVar5 = 4;
                      if (((script != Script_Sinhala) || (uVar3 != 4)) &&
                         ((script != Script_Malayalam ||
                          ((uVar3 != 4 || (text[from + lVar7 + lVar11 + -1] != L'ു'))))))
                      goto switchD_0033df64_caseD_0;
                    }
                  }
                  break;
                case 4:
                  if (uVar3 < 5) {
                    uVar4 = 0x16;
LAB_0033dfd1:
                    if ((uVar4 >> (uVar3 & 0x1f) & 1) != 0) break;
                  }
LAB_0033e11a:
                  if (((script != Script_Bengali) || (uVar6 != 0x9be)) ||
                     (uVar5 = uVar8, text[from + lVar7 + lVar11 + -1] != L'অ'))
                  goto switchD_0033df64_caseD_0;
                  break;
                case 5:
                  if (8 < uVar3) goto LAB_0033e11a;
                  if ((400U >> (uVar3 & 0x1f) & 1) == 0) {
                    uVar4 = 6;
                    goto LAB_0033dfd1;
                  }
                  break;
                case 6:
                  if ((8 < uVar3) ||
                     ((((400U >> (uVar3 & 0x1f) & 1) == 0 && ((6U >> (uVar3 & 0x1f) & 1) == 0)) &&
                      (uVar5 = 6, uVar3 != 5)))) goto LAB_0033e11a;
                  break;
                case 8:
                  uVar5 = 8;
                  if (uVar3 != 4) goto switchD_0033df64_caseD_0;
                  break;
                case 9:
                  if (uVar3 == 3) {
                    uVar5 = 3;
                    if (uVar6 != 0x200d) goto LAB_0033e17a;
                  }
                  else if ((script == Script_Bengali) && (uVar3 == 1)) {
                    if ((uVar6 != 0x200d) || (uVar5 = 1, text[from + lVar7 + lVar11 + -1] != L'র')
                       ) {
LAB_0033e17a:
                      lVar11 = lVar11 + 1;
                      goto switchD_0033df64_caseD_0;
                    }
                  }
                  else if ((script != Script_Kannada) ||
                          (((uVar3 != 1 || (uVar6 != 0x200d)) ||
                           (uVar5 = 1, text[from + lVar7 + lVar11 + -1] != L'ರ'))))
                  goto LAB_0033e17a;
                }
              }
              uVar3 = uVar5;
              lVar12 = lVar11 + 1;
              lVar11 = lVar10;
            } while (lVar10 != lVar12);
          }
        }
      }
      else {
        bVar1 = indicForms[uVar9 - 0x900];
        uVar3 = (uint)bVar1;
        if ((bVar1 == 7) || (lVar11 = 1, bVar1 == 1)) goto LAB_0033def1;
      }
switchD_0033df64_caseD_0:
      attributes[lVar7 + from] = (QCharAttributes)((byte)attributes[lVar7 + from] | 1);
      lVar12 = lVar11 + lVar7;
      if (len <= lVar11 + lVar7) {
        lVar12 = len;
      }
      lVar11 = lVar7 + 1;
      lVar7 = lVar11;
      if (lVar11 < lVar12) {
        do {
          attributes[lVar11 + from] = (QCharAttributes)((byte)attributes[lVar11 + from] & 0xfe);
          lVar11 = lVar11 + 1;
          lVar7 = lVar12;
        } while (lVar12 != lVar11);
      }
    } while (lVar7 < len);
  }
  return;
}

Assistant:

static void indicAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    attributes += from;
    qsizetype i = 0;
    while (i < len) {
        bool invalid;
        qsizetype boundary = indic_nextSyllableBoundary(script, text, from+i, end, &invalid) - from;
         attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }


}